

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_firstwrite(Curl_easy *data)

{
  undefined1 *puVar1;
  int *piVar2;
  uint uVar3;
  connectdata *conn;
  curl_trc_feat *pcVar4;
  long lVar5;
  _Bool _Var6;
  
  conn = data->conn;
  if ((data->req).newurl != (char *)0x0) {
    if (((ulong)conn->bits & 0x20) != 0) goto LAB_00132c14;
    puVar1 = &(data->req).field_0xda;
    *puVar1 = *puVar1 | 4;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
      Curl_infof(data,"Ignoring the response-body");
    }
  }
  lVar5 = (data->state).resume_from;
  if ((((lVar5 == 0) || (uVar3 = *(uint *)&(data->req).field_0xd9, (uVar3 & 4) != 0)) ||
      ((uVar3 >> 10 & 1) != 0)) || ((data->state).httpreq != '\0')) {
    if ((data->set).timecondition == '\0') {
      return CURLE_OK;
    }
    if ((data->state).range != (char *)0x0) {
      return CURLE_OK;
    }
    _Var6 = Curl_meets_timecondition(data,(data->req).timeofdoc);
    if (_Var6) {
      return CURLE_OK;
    }
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 | 2;
    (data->info).httpcode = 0x130;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
      Curl_infof(data,"Simulate an HTTP 304 response");
    }
    Curl_conncontrol(conn,2);
    return CURLE_OK;
  }
  if ((data->req).size != lVar5) {
    Curl_failf(data,"HTTP server does not seem to support byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
    Curl_infof(data,"The entire document is already downloaded");
  }
  Curl_conncontrol(conn,2);
LAB_00132c14:
  piVar2 = &(data->req).keepon;
  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
  puVar1 = &(data->req).field_0xd9;
  *puVar1 = *puVar1 | 2;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_firstwrite(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct SingleRequest *k = &data->req;

  if(data->req.newurl) {
    if(conn->bits.close) {
      /* Abort after the headers if "follow Location" is set
         and we are set to close anyway. */
      k->keepon &= ~KEEP_RECV;
      k->done = TRUE;
      return CURLE_OK;
    }
    /* We have a new URL to load, but since we want to be able to reuse this
       connection properly, we read the full response in "ignore more" */
    k->ignorebody = TRUE;
    infof(data, "Ignoring the response-body");
  }
  if(data->state.resume_from && !k->content_range &&
     (data->state.httpreq == HTTPREQ_GET) &&
     !k->ignorebody) {

    if(k->size == data->state.resume_from) {
      /* The resume point is at the end of file, consider this fine even if it
         does not allow resume from here. */
      infof(data, "The entire document is already downloaded");
      streamclose(conn, "already downloaded");
      /* Abort download */
      k->keepon &= ~KEEP_RECV;
      k->done = TRUE;
      return CURLE_OK;
    }

    /* we wanted to resume a download, although the server does not seem to
     * support this and we did this with a GET (if it was not a GET we did a
     * POST or PUT resume) */
    failf(data, "HTTP server does not seem to support "
          "byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }

  if(data->set.timecondition && !data->state.range) {
    /* A time condition has been set AND no ranges have been requested. This
       seems to be what chapter 13.3.4 of RFC 2616 defines to be the correct
       action for an HTTP/1.1 client */

    if(!Curl_meets_timecondition(data, k->timeofdoc)) {
      k->done = TRUE;
      /* We are simulating an HTTP 304 from server so we return
         what should have been returned from the server */
      data->info.httpcode = 304;
      infof(data, "Simulate an HTTP 304 response");
      /* we abort the transfer before it is completed == we ruin the
         reuse ability. Close the connection */
      streamclose(conn, "Simulated 304 handling");
      return CURLE_OK;
    }
  } /* we have a time condition */

  return CURLE_OK;
}